

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::FreeList<wabt::interp::Object_*>::Delete
          (FreeList<wabt::interp::Object_*> *this,Index index)

{
  Index IVar1;
  bool bVar2;
  reference ppOVar3;
  Index index_local;
  FreeList<wabt::interp::Object_*> *this_local;
  
  bVar2 = IsUsed(this,index);
  if (!bVar2) {
    __assert_fail("IsUsed(index)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                  ,0xd5,
                  "void wabt::interp::FreeList<wabt::interp::Object *>::Delete(Index) [T = wabt::interp::Object *]"
                 );
  }
  ppOVar3 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::operator[]
                      (&this->list_,index);
  if (*ppOVar3 != (value_type)0x0) {
    (*(*ppOVar3)->_vptr_Object[1])();
  }
  IVar1 = this->free_head_;
  ppOVar3 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::operator[]
                      (&this->list_,index);
  *ppOVar3 = (value_type)(IVar1 << 1 | 1);
  this->free_head_ = index + 1;
  this->free_items_ = this->free_items_ + 1;
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  assert(IsUsed(index));

  delete list_[index];
  list_[index] = reinterpret_cast<T>((free_head_ << ptrFreeShift) | ptrFreeBit);
  free_head_ = index + 1;
  free_items_++;
}